

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::clara::detail::TokenStream::loadBuffer(TokenStream *this)

{
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *this_00;
  char *pcVar1;
  pointer pcVar2;
  long lVar3;
  _Alloc_hider _Var4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string opt;
  undefined1 local_78 [8];
  _Alloc_hider local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  long local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = &this->m_tokenBuffer;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::resize
            (this_00,0);
  pbVar6 = (this->it)._M_current;
  while( true ) {
    if (pbVar6 == (this->itEnd)._M_current) {
      return;
    }
    if (pbVar6->_M_string_length != 0) break;
    pbVar6 = pbVar6 + 1;
    (this->it)._M_current = pbVar6;
  }
  pcVar1 = (pbVar6->_M_dataplus)._M_p;
  if (*pcVar1 == '-') {
    lVar3 = ::std::__cxx11::string::find_first_of((char *)pbVar6,0x1ab736,0);
    if (lVar3 != -1) {
      local_78._0_4_ = Option;
      ::std::__cxx11::string::substr((ulong)local_70,(ulong)pbVar6);
      std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
      emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70[0]._M_p != &local_60) {
        operator_delete(local_70[0]._M_p,local_60._M_allocated_capacity + 1);
      }
      local_78._0_4_ = Argument;
      ::std::__cxx11::string::substr((ulong)local_70,(ulong)pbVar6);
      std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
      emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
      local_40._M_allocated_capacity = local_60._M_allocated_capacity;
      _Var4._M_p = local_70[0]._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70[0]._M_p == &local_60) {
        return;
      }
      goto LAB_001794c3;
    }
    pcVar2 = (pbVar6->_M_dataplus)._M_p;
    if (2 < pbVar6->_M_string_length && pcVar2[1] != '-') {
      local_50 = &local_40;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"- ","");
      if (1 < pbVar6->_M_string_length) {
        uVar5 = 1;
        do {
          local_50->_M_local_buf[1] = (pbVar6->_M_dataplus)._M_p[uVar5];
          local_78._0_4_ = Option;
          local_70[0]._M_p = (pointer)&local_60;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_70,local_50,local_50->_M_local_buf + local_48);
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70[0]._M_p != &local_60) {
            operator_delete(local_70[0]._M_p,local_60._M_allocated_capacity + 1);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < pbVar6->_M_string_length);
      }
      _Var4._M_p = (pointer)local_50;
      if (local_50 == &local_40) {
        return;
      }
      goto LAB_001794c3;
    }
    local_78._0_4_ = Option;
    local_70[0]._M_p = (pointer)&local_60;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar2,pcVar2 + pbVar6->_M_string_length);
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
    emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
  }
  else {
    local_78._0_4_ = Argument;
    local_70[0]._M_p = (pointer)&local_60;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar1,pcVar1 + pbVar6->_M_string_length);
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
    emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
  }
  local_40._M_allocated_capacity = local_60._M_allocated_capacity;
  _Var4._M_p = local_70[0]._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70[0]._M_p == &local_60) {
    return;
  }
LAB_001794c3:
  operator_delete(_Var4._M_p,local_40._M_allocated_capacity + 1);
  return;
}

Assistant:

void loadBuffer() {
            m_tokenBuffer.resize( 0 );

            // Skip any empty strings
            while( it != itEnd && it->empty() )
                ++it;

            if( it != itEnd ) {
                auto const &next = *it;
                if( isOptPrefix( next[0] ) ) {
                    auto delimiterPos = next.find_first_of( " :=" );
                    if( delimiterPos != std::string::npos ) {
                        m_tokenBuffer.push_back( { TokenType::Option, next.substr( 0, delimiterPos ) } );
                        m_tokenBuffer.push_back( { TokenType::Argument, next.substr( delimiterPos + 1 ) } );
                    } else {
                        if( next[1] != '-' && next.size() > 2 ) {
                            std::string opt = "- ";
                            for( size_t i = 1; i < next.size(); ++i ) {
                                opt[1] = next[i];
                                m_tokenBuffer.push_back( { TokenType::Option, opt } );
                            }
                        } else {
                            m_tokenBuffer.push_back( { TokenType::Option, next } );
                        }
                    }
                } else {
                    m_tokenBuffer.push_back( { TokenType::Argument, next } );
                }
            }
        }